

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_TEXLDL(Context *ctx)

{
  int iVar1;
  Context *ctx_local;
  
  iVar1 = shader_is_vertex(ctx);
  if ((iVar1 == 0) || (ctx->profile_supports_nv3 != 0)) {
    iVar1 = shader_is_pixel(ctx);
    if ((iVar1 == 0) || (ctx->profile_supports_nv2 != 0)) {
      arb1_texld(ctx,"TXL",0);
    }
    else {
      failf(ctx,"Pixel shader TEXLDL unsupported in %s profile",ctx->profile->name);
    }
  }
  else {
    failf(ctx,"Vertex shader TEXLDL unsupported in %s profile",ctx->profile->name);
  }
  return;
}

Assistant:

static void emit_ARB1_TEXLDL(Context *ctx)
{
    if ((shader_is_vertex(ctx)) && (!support_nv3(ctx)))
    {
        failf(ctx, "Vertex shader TEXLDL unsupported in %s profile",
              ctx->profile->name);
        return;
    } // if

    else if ((shader_is_pixel(ctx)) && (!support_nv2(ctx)))
    {
        failf(ctx, "Pixel shader TEXLDL unsupported in %s profile",
              ctx->profile->name);
        return;
    } // if

    // !!! FIXME: this doesn't map exactly to TEXLDL. Review this.
    arb1_texld(ctx, "TXL", 0);
}